

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixCurrentTime(sqlite3_vfs *NotUsed,double *prNow)

{
  long in_FS_OFFSET;
  timeval local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.tv_sec = (__time_t)&DAT_aaaaaaaaaaaaaaaa;
  local_28.tv_usec = (__suseconds_t)&DAT_aaaaaaaaaaaaaaaa;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  *prNow = (double)(local_28.tv_usec / 1000 + local_28.tv_sec * 1000 + 0xbfc83e532200) / 86400000.0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int unixCurrentTime(sqlite3_vfs *NotUsed, double *prNow){
  sqlite3_int64 i = 0;
  int rc;
  UNUSED_PARAMETER(NotUsed);
  rc = unixCurrentTimeInt64(0, &i);
  *prNow = i/86400000.0;
  return rc;
}